

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
emplace_back<slang::IntervalMapDetails::BranchNode<int,12u,true>*&,unsigned_int&,unsigned_int&>
          (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this,
          BranchNode<int,_12U,_true> **args,uint *args_1,uint *args_2)

{
  uint uVar1;
  uint uVar2;
  pointer pEVar3;
  ulong uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  pointer pEVar7;
  pointer pEVar8;
  pointer pEVar9;
  long lVar10;
  long lVar11;
  pointer __src;
  size_type sVar12;
  ulong uVar13;
  
  pEVar3 = this->data_;
  sVar12 = this->len;
  __src = pEVar3 + sVar12;
  if (sVar12 != this->cap) {
    uVar1 = *args_1;
    uVar2 = *args_2;
    __src->node = *args;
    __src->size = uVar1;
    __src->offset = uVar2;
    this->len = sVar12 + 1;
    return pEVar3 + sVar12;
  }
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar13 = this->len + 1;
  uVar4 = this->cap;
  if (uVar13 < uVar4 * 2) {
    uVar13 = uVar4 * 2;
  }
  if (0x7ffffffffffffff - uVar4 < uVar4) {
    uVar13 = 0x7ffffffffffffff;
  }
  lVar11 = (long)__src - (long)this->data_;
  pEVar7 = (pointer)operator_new(uVar13 << 4);
  uVar1 = *args_1;
  uVar2 = *args_2;
  *(BranchNode<int,_12U,_true> **)((long)pEVar7 + lVar11) = *args;
  *(uint *)((long)pEVar7 + lVar11 + 8) = uVar1;
  *(uint *)((long)pEVar7 + lVar11 + 0xc) = uVar2;
  pEVar3 = this->data_;
  sVar12 = this->len;
  lVar10 = (long)pEVar3 + (sVar12 * 0x10 - (long)__src);
  pEVar8 = pEVar3;
  pEVar9 = pEVar7;
  if (lVar10 == 0) {
    pEVar8 = pEVar7;
    pEVar9 = pEVar3;
    if (sVar12 != 0) {
      do {
        uVar5 = pEVar9->size;
        uVar6 = pEVar9->offset;
        pEVar8->node = pEVar9->node;
        pEVar8->size = uVar5;
        pEVar8->offset = uVar6;
        pEVar9 = pEVar9 + 1;
        pEVar8 = pEVar8 + 1;
      } while (pEVar9 != __src);
    }
  }
  else {
    for (; pEVar8 != __src; pEVar8 = pEVar8 + 1) {
      uVar5 = pEVar8->size;
      uVar6 = pEVar8->offset;
      pEVar9->node = pEVar8->node;
      pEVar9->size = uVar5;
      pEVar9->offset = uVar6;
      pEVar9 = pEVar9 + 1;
    }
    memcpy((void *)((long)pEVar7 + lVar11 + 0x10),__src,(lVar10 - 0x10U & 0xfffffffffffffff0) + 0x10
          );
  }
  if (pEVar3 != (pointer)this->firstElement) {
    operator_delete(pEVar3);
    sVar12 = this->len;
  }
  this->len = sVar12 + 1;
  this->cap = uVar13;
  this->data_ = pEVar7;
  return (reference)((long)pEVar7 + lVar11);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }